

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O3

string * __thiscall
QPDFFileSpecObjectHelper::getFilename_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFileSpecObjectHelper *this)

{
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  QPDFObjectHandle k;
  string local_50;
  
  pbVar1 = name_keys_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (name_keys_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      name_keys_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar3 = name_keys_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_50._M_dataplus._M_p =
           (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_50._M_string_length =
           (size_type)
           (this->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length)->
                 _M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length)->
                 _M_use_count + 1;
        }
      }
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_50.field_2,&local_50);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
      }
      bVar2 = QPDFObjectHandle::isString((QPDFObjectHandle *)&local_50.field_2);
      if (bVar2) {
        QPDFObjectHandle::getUTF8Value_abi_cxx11_
                  (__return_storage_ptr__,(QPDFObjectHandle *)&local_50.field_2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.field_2._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return __return_storage_ptr__;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.field_2._8_8_);
        return __return_storage_ptr__;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.field_2._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.field_2._8_8_);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFileSpecObjectHelper::getFilename()
{
    for (auto const& i: name_keys) {
        auto k = oh().getKey(i);
        if (k.isString()) {
            return k.getUTF8Value();
        }
    }
    return "";
}